

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O1

Path * FileSystemUtils::operator/(Path *__return_storage_ptr__,Path *lhs_,Path *rhs_)

{
  size_type sVar1;
  ulong uVar2;
  long *plVar3;
  long *plVar4;
  pointer pcVar5;
  pointer pcVar6;
  __string_type __str;
  string strlhs;
  long *local_88;
  ulong local_80;
  long local_78 [2];
  long *local_68;
  long local_60;
  long local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  sVar1 = (lhs_->m_string)._M_string_length;
  if (sVar1 == 0) {
    __return_storage_ptr__->_vptr_Path = (_func_int **)&PTR__Path_001198d8;
    (__return_storage_ptr__->m_string)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_string).field_2;
    pcVar6 = (rhs_->m_string)._M_dataplus._M_p;
    pcVar5 = pcVar6 + (rhs_->m_string)._M_string_length;
  }
  else {
    if ((rhs_->m_string)._M_string_length != 0) {
      pcVar6 = (lhs_->m_string)._M_dataplus._M_p;
      local_48 = local_38;
      std::__cxx11::string::_M_construct<char*>((string *)&local_48,pcVar6,pcVar6 + sVar1);
      while (local_40 != 0) {
        uVar2 = std::__cxx11::string::find_last_of((char *)&local_48,0x1140b3,0xffffffffffffffff);
        if (uVar2 != local_40 - 1U) break;
        std::__cxx11::string::erase((ulong)&local_48,local_40 - 1U);
      }
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,local_48,local_40 + (long)local_48);
      std::__cxx11::string::_M_replace_aux((ulong)&local_88,local_80,0,'\x01');
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_88,(ulong)(rhs_->m_string)._M_dataplus._M_p);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_58 = *plVar4;
        uStack_50 = (undefined4)plVar3[3];
        uStack_4c = *(undefined4 *)((long)plVar3 + 0x1c);
        local_68 = &local_58;
      }
      else {
        local_58 = *plVar4;
        local_68 = (long *)*plVar3;
      }
      local_60 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      __return_storage_ptr__->_vptr_Path = (_func_int **)&PTR__Path_001198d8;
      (__return_storage_ptr__->m_string)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_string).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_string,local_68,local_60 + (long)local_68);
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58 + 1);
      }
      if (local_88 != local_78) {
        operator_delete(local_88,local_78[0] + 1);
      }
      if (local_48 == local_38) {
        return __return_storage_ptr__;
      }
      operator_delete(local_48,local_38[0] + 1);
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->_vptr_Path = (_func_int **)&PTR__Path_001198d8;
    (__return_storage_ptr__->m_string)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_string).field_2;
    pcVar6 = (lhs_->m_string)._M_dataplus._M_p;
    pcVar5 = pcVar6 + (lhs_->m_string)._M_string_length;
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_string,pcVar6,pcVar5);
  return __return_storage_ptr__;
}

Assistant:

inline Path operator/( const Path& lhs_, const Path& rhs_ )
    {
        if( 0 == lhs_.m_string.length() )
        {
            return rhs_;
        }
        if( 0 == rhs_.m_string.length() )
        {
            return lhs_;
        }
        std::string strlhs = lhs_.m_string;
        while( strlhs.length() && strlhs.find_last_of( FILESYSTEMUTILS_SEPERATORS ) == strlhs.length()-1 )
        {
        	strlhs.erase(strlhs.length()-1, 1);
        }
        
        //note: should probably remove preceding seperators to rhs_, but this has not as yet occured
        Path join = strlhs + Path::seperator + rhs_.m_string;
        return join;
    }